

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_help.c
# Opt level: O3

void tool_list_engines(void)

{
  undefined8 uVar1;
  curl_slist *engines;
  undefined8 *local_20;
  
  uVar1 = curl_easy_init();
  local_20 = (undefined8 *)0x0;
  curl_easy_getinfo(uVar1,0x40001b,&local_20);
  puts("Build-time engines:");
  if (local_20 == (undefined8 *)0x0) {
    puts("  <none>");
  }
  else {
    do {
      curl_mprintf("  %s\n",*local_20);
      local_20 = (undefined8 *)local_20[1];
    } while (local_20 != (undefined8 *)0x0);
    local_20 = (undefined8 *)0x0;
  }
  curl_slist_free_all(local_20);
  curl_easy_cleanup(uVar1);
  return;
}

Assistant:

void tool_list_engines(void)
{
  CURL *curl = curl_easy_init();
  struct curl_slist *engines = NULL;

  /* Get the list of engines */
  curl_easy_getinfo(curl, CURLINFO_SSL_ENGINES, &engines);

  puts("Build-time engines:");
  if(engines) {
    for(; engines; engines = engines->next)
      printf("  %s\n", engines->data);
  }
  else {
    puts("  <none>");
  }

  /* Cleanup the list of engines */
  curl_slist_free_all(engines);
  curl_easy_cleanup(curl);
}